

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_get_high_motion_content_screen_rtc(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *local_40;
  AV1_COMP *cpi;
  int *arg;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  aom_codec_err_t local_4;
  
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_40 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_40 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = local_40 + 1;
  }
  if ((int *)*local_40 == (int *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    *(int *)*local_40 = (ctx->ppi->cpi->rc).high_motion_content_screen_rtc;
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_high_motion_content_screen_rtc(
    aom_codec_alg_priv_t *ctx, va_list args) {
  int *arg = va_arg(args, int *);
  AV1_COMP *const cpi = ctx->ppi->cpi;
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  *arg = cpi->rc.high_motion_content_screen_rtc;
  return AOM_CODEC_OK;
}